

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::test_LockDirectory::test_method(test_LockDirectory *this)

{
  long lVar1;
  bool bVar2;
  __pid_t _Var3;
  int iVar4;
  LockResult LVar5;
  __sighandler_t __handler;
  iterator in_R8;
  iterator pvVar6;
  thread *ptVar7;
  iterator pvVar8;
  iterator in_R9;
  char *pcVar9;
  LockResult *pLVar10;
  int *piVar11;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined4 local_5dc;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  int processstatus;
  undefined8 local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  LockResult threadresult;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  thread thr;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char ch;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  pid_t pid;
  char *local_158;
  char *local_150;
  undefined **local_148;
  undefined1 local_140;
  undefined1 *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  path local_108;
  path local_e0;
  int fd [2];
  path lockname;
  path local_88;
  path dirname;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  fs::operator/(&dirname,(path *)&local_88,"lock_dir");
  std::filesystem::__cxx11::path::~path(&local_88);
  fs::path::path(&lockname,".lock");
  __handler = ::signal(0x11,(__sighandler_t)0x0);
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x49f;
  file.m_begin = (iterator)&local_118;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_128,msg);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_150 = "";
  thr._M_id._M_thread._0_4_ = socketpair(1,1,0,fd);
  ptVar7 = &thr;
  local_390._0_4_ = 0;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_148,&local_158,0x49f,1,2,ptVar7,"socketpair(1, SOCK_STREAM, 0, fd)",&local_390,
             "0");
  _Var3 = fork();
  pid = _Var3;
  if (_Var3 == 0) {
    local_170 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_168 = "";
    local_180 = &boost::unit_test::basic_cstring<char_const>::null;
    local_178 = &boost::unit_test::basic_cstring<char_const>::null;
    file_27.m_end = (iterator)0x4a2;
    file_27.m_begin = (iterator)&local_170;
    msg_27.m_end = (iterator)ptVar7;
    msg_27.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_180,
               msg_27);
    local_140 = 0;
    local_148 = &PTR__lazy_ostream_011480b0;
    local_138 = boost::unit_test::lazy_ostream::inst;
    local_130 = "";
    local_190 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
    local_188 = "";
    iVar4 = close(fd[1]);
    thr._M_id._M_thread._0_4_ = iVar4;
    local_390 = (ulong)local_390._4_4_ << 0x20;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_148,&local_190,0x4a2,1,2,&thr,"close(fd[1])",&local_390,"0");
    std::filesystem::__cxx11::path::path(&local_e0,&dirname.super_path);
    std::filesystem::__cxx11::path::path(&local_108,&lockname.super_path);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      TestOtherProcess((path *)&local_e0,(path *)&local_108,fd[0]);
    }
    goto LAB_005bedc1;
  }
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x4a5;
  file_00.m_begin = (iterator)&local_1a0;
  msg_00.m_end = (iterator)ptVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1b0,
             msg_00);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1b8 = "";
  iVar4 = close(fd[0]);
  ptVar7 = &thr;
  thr._M_id._M_thread._0_4_ = iVar4;
  local_390._0_4_ = 0;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_148,&local_1c0,0x4a5,1,2,ptVar7,"close(fd[0])",&local_390,"0");
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x4a9;
  file_01.m_begin = (iterator)&local_1d8;
  msg_01.m_end = (iterator)ptVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1e8,
             msg_01);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1f0 = "";
  thr._M_id._M_thread = (id)::write(fd[1],&LockCommand,1);
  ptVar7 = &thr;
  local_390._0_4_ = 1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_148,&local_1f8,0x4a9,1,2,ptVar7,"write(fd[1], &LockCommand, 1)",&local_390,"1");
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x4aa;
  file_02.m_begin = (iterator)&local_210;
  msg_02.m_end = (iterator)ptVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_220,
             msg_02);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_228 = "";
  thr._M_id._M_thread = (id)::read(fd[1],&ch,1);
  ptVar7 = &thr;
  local_390._0_4_ = 1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_148,&local_230,0x4aa,1,2,ptVar7,"read(fd[1], &ch, 1)",&local_390,"1");
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x4ab;
  file_03.m_begin = (iterator)&local_240;
  msg_03.m_end = (iterator)ptVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_250,
             msg_03);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_258 = "";
  ptVar7 = &thr;
  thr._M_id._M_thread._0_1_ = 3;
  pcVar9 = "ResErrorWrite";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,util_tests::__2>
            (&local_148,&local_260,0x4ab,&ch);
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x4ae;
  file_04.m_begin = (iterator)&local_270;
  msg_04.m_end = pcVar9;
  msg_04.m_begin = (iterator)ptVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_280,
             msg_04);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_288 = "";
  LVar5 = util::LockDirectory(&dirname,&lockname,false);
  ptVar7 = &thr;
  thr._M_id._M_thread._0_4_ = LVar5;
  local_390 = CONCAT44(local_390._4_4_,1);
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,util::LockResult,util::LockResult>
            (&local_148,&local_290,0x4ae,1,2,ptVar7,"util::LockDirectory(dirname, lockname)",
             &local_390,"util::LockResult::ErrorWrite");
  bVar2 = std::filesystem::is_symlink(&dirname.super_path);
  if (bVar2) {
    bVar2 = std::filesystem::is_directory(&dirname.super_path);
    if (!bVar2) goto LAB_005bd8ad;
  }
  else {
LAB_005bd8ad:
    std::filesystem::create_directories((path *)&dirname);
  }
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x4b3;
  file_05.m_begin = (iterator)&local_2a0;
  msg_05.m_end = (iterator)ptVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2b0,
             msg_05);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2b8 = "";
  LVar5 = util::LockDirectory(&dirname,&lockname,true);
  ptVar7 = &thr;
  thr._M_id._M_thread._0_4_ = LVar5;
  local_390 = local_390 & 0xffffffff00000000;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,util::LockResult,util::LockResult>
            (&local_148,&local_2c0,0x4b3,1,2,ptVar7,"util::LockDirectory(dirname, lockname, true)",
             &local_390,"util::LockResult::Success");
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x4b6;
  file_06.m_begin = (iterator)&local_2d0;
  msg_06.m_end = (iterator)ptVar7;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2e0,
             msg_06);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2e8 = "";
  LVar5 = util::LockDirectory(&dirname,&lockname,false);
  ptVar7 = &thr;
  thr._M_id._M_thread._0_4_ = LVar5;
  local_390 = local_390 & 0xffffffff00000000;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,util::LockResult,util::LockResult>
            (&local_148,&local_2f0,0x4b6,1,2,ptVar7,"util::LockDirectory(dirname, lockname)",
             &local_390,"util::LockResult::Success");
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x4b9;
  file_07.m_begin = (iterator)&local_300;
  msg_07.m_end = (iterator)ptVar7;
  msg_07.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_310,
             msg_07);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_318 = "";
  LVar5 = util::LockDirectory(&dirname,&lockname,false);
  ptVar7 = &thr;
  thr._M_id._M_thread._0_4_ = LVar5;
  local_390 = local_390 & 0xffffffff00000000;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,util::LockResult,util::LockResult>
            (&local_148,&local_320,0x4b9,1,2,ptVar7,"util::LockDirectory(dirname, lockname)",
             &local_390,"util::LockResult::Success");
  thr._M_id._M_thread = (id)0;
  local_148 = (undefined **)operator_new(0x20);
  *local_148 = (undefined *)&PTR___State_0114d630;
  local_148[1] = (undefined *)&threadresult;
  local_148[2] = (undefined *)&dirname;
  local_148[3] = (undefined *)&lockname;
  std::thread::_M_start_thread(&thr,&local_148,0);
  if (local_148 != (undefined **)0x0) {
    (**(code **)(*local_148 + 8))();
  }
  std::thread::join();
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x4bf;
  file_08.m_begin = (iterator)&local_338;
  msg_08.m_end = (iterator)ptVar7;
  msg_08.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_348,
             msg_08);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_350 = "";
  local_390 = local_390 & 0xffffffff00000000;
  pvVar6 = (iterator)0x2;
  pLVar10 = &threadresult;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,util::LockResult,util::LockResult>
            (&local_148,&local_358,0x4bf,1,2,pLVar10,"threadresult",&local_390,
             "util::LockResult::Success");
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x4c2;
  file_09.m_begin = (iterator)&local_368;
  msg_09.m_end = (iterator)pLVar10;
  msg_09.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_378,
             msg_09);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_380 = "";
  local_390 = ::write(fd[1],&LockCommand,1);
  pvVar6 = (iterator)&local_390;
  processstatus = 1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_148,&local_388,0x4c2,1,2,pvVar6,"write(fd[1], &LockCommand, 1)",&processstatus,
             "1");
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x4c3;
  file_10.m_begin = (iterator)&local_3a8;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3b8,
             msg_10);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3c0 = "";
  local_390 = ::read(fd[1],&ch,1);
  pvVar6 = (iterator)&local_390;
  processstatus = 1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_148,&local_3c8,0x4c3,1,2,pvVar6,"read(fd[1], &ch, 1)",&processstatus,"1");
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x4c4;
  file_11.m_begin = (iterator)&local_3d8;
  msg_11.m_end = pvVar6;
  msg_11.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3e8,
             msg_11);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3f0 = "";
  pvVar6 = (iterator)&local_390;
  local_390 = CONCAT71(local_390._1_7_,4);
  pcVar9 = "ResErrorLock";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,util_tests::__2>
            (&local_148,&local_3f8,0x4c4,&ch);
  ReleaseDirectoryLocks();
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x4c9;
  file_12.m_begin = (iterator)&local_408;
  msg_12.m_end = pcVar9;
  msg_12.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_418,
             msg_12);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_420 = "";
  LVar5 = util::LockDirectory(&dirname,&lockname,true);
  pvVar6 = (iterator)&local_390;
  local_390 = CONCAT44(local_390._4_4_,LVar5);
  processstatus = 0;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,util::LockResult,util::LockResult>
            (&local_148,&local_428,0x4c9,1,2,pvVar6,"util::LockDirectory(dirname, lockname, true)",
             &processstatus,"util::LockResult::Success");
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x4cc;
  file_13.m_begin = (iterator)&local_438;
  msg_13.m_end = pvVar6;
  msg_13.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_448,
             msg_13);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_450 = "";
  local_390 = ::write(fd[1],&LockCommand,1);
  pvVar6 = (iterator)&local_390;
  processstatus = 1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_148,&local_458,0x4cc,1,2,pvVar6,"write(fd[1], &LockCommand, 1)",&processstatus,
             "1");
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x4cd;
  file_14.m_begin = (iterator)&local_468;
  msg_14.m_end = pvVar6;
  msg_14.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_478,
             msg_14);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_480 = "";
  local_390 = ::read(fd[1],&ch,1);
  pvVar6 = (iterator)&local_390;
  processstatus = 1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_148,&local_488,0x4cd,1,2,pvVar6,"read(fd[1], &ch, 1)",&processstatus,"1");
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x4ce;
  file_15.m_begin = (iterator)&local_498;
  msg_15.m_end = pvVar6;
  msg_15.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_4a8,
             msg_15);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4b0 = "";
  pvVar6 = (iterator)&local_390;
  local_390 = CONCAT71(local_390._1_7_,2);
  pcVar9 = "ResSuccess";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,util_tests::__2>
            (&local_148,&local_4b8,0x4ce,&ch);
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x4d1;
  file_16.m_begin = (iterator)&local_4c8;
  msg_16.m_end = pcVar9;
  msg_16.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_4d8,
             msg_16);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4e0 = "";
  LVar5 = util::LockDirectory(&dirname,&lockname,true);
  pvVar6 = (iterator)&local_390;
  local_390 = CONCAT44(local_390._4_4_,LVar5);
  processstatus = 2;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,util::LockResult,util::LockResult>
            (&local_148,&local_4e8,0x4d1,1,2,pvVar6,"util::LockDirectory(dirname, lockname, true)",
             &processstatus,"util::LockResult::ErrorLock");
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x4d4;
  file_17.m_begin = (iterator)&local_4f8;
  msg_17.m_end = pvVar6;
  msg_17.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_508,
             msg_17);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_510 = "";
  local_390 = ::write(fd[1],&UnlockCommand,1);
  pvVar6 = (iterator)&local_390;
  processstatus = 1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_148,&local_518,0x4d4,1,2,pvVar6,"write(fd[1], &UnlockCommand, 1)",&processstatus
             ,"1");
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x4d5;
  file_18.m_begin = (iterator)&local_528;
  msg_18.m_end = pvVar6;
  msg_18.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_538,
             msg_18);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_540 = "";
  local_390 = ::read(fd[1],&ch,1);
  pvVar6 = (iterator)&local_390;
  processstatus = 1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_148,&local_548,0x4d5,1,2,pvVar6,"read(fd[1], &ch, 1)",&processstatus,"1");
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x4d6;
  file_19.m_begin = (iterator)&local_558;
  msg_19.m_end = pvVar6;
  msg_19.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_568,
             msg_19);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_578 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_570 = "";
  pvVar6 = (iterator)&local_390;
  local_390 = CONCAT71(local_390._1_7_,5);
  pcVar9 = "ResUnlockSuccess";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,util_tests::__2>
            (&local_148,&local_578,0x4d6,&ch);
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x4d9;
  file_20.m_begin = (iterator)&local_588;
  msg_20.m_end = pcVar9;
  msg_20.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_598,
             msg_20);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_5a0 = "";
  LVar5 = util::LockDirectory(&dirname,&lockname,true);
  pvVar6 = (iterator)&local_390;
  local_390 = CONCAT44(local_390._4_4_,LVar5);
  processstatus = 0;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,util::LockResult,util::LockResult>
            (&local_148,&local_5a8,0x4d9,1,2,pvVar6,"util::LockDirectory(dirname, lockname, true)",
             &processstatus,"util::LockResult::Success");
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x4df;
  file_21.m_begin = (iterator)&local_5b8;
  msg_21.m_end = pvVar6;
  msg_21.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_5c8,
             msg_21);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_5d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_5d0 = "";
  local_390 = ::write(fd[1],&LockCommand,1);
  pvVar6 = (iterator)&local_390;
  local_5dc = 1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_148,&local_5d8,0x4df,1,2,pvVar6,"write(fd[1], &LockCommand, 1)",&local_5dc,"1");
  local_5f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x4e3;
  file_22.m_begin = (iterator)&local_5f0;
  msg_22.m_end = pvVar6;
  msg_22.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_600,
             msg_22);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_610 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_608 = "";
  local_390 = ::write(fd[1],&ExitCommand,1);
  pvVar6 = (iterator)&local_390;
  local_5dc = 1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_148,&local_610,0x4e3,1,2,pvVar6,"write(fd[1], &ExitCommand, 1)",&local_5dc,"1");
  local_620 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_618 = "";
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x4e4;
  file_23.m_begin = (iterator)&local_620;
  msg_23.m_end = pvVar6;
  msg_23.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_630,
             msg_23);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_638 = "";
  _Var3 = waitpid(_Var3,&processstatus,0);
  pvVar6 = (iterator)0x2;
  pvVar8 = (iterator)&local_390;
  local_390._0_4_ = _Var3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_148,&local_640,0x4e4,1,2,&local_390,"waitpid(pid, &processstatus, 0)",&pid,"pid"
            );
  local_650 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_648 = "";
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x4e5;
  file_24.m_begin = (iterator)&local_650;
  msg_24.m_end = pvVar8;
  msg_24.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_660,
             msg_24);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_668 = "";
  local_390._0_4_ = 0;
  pvVar6 = (iterator)0x2;
  piVar11 = &processstatus;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_148,&local_670,0x4e5,1,2,piVar11,"processstatus",&local_390,"0");
  local_680 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_678 = "";
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x4e6;
  file_25.m_begin = (iterator)&local_680;
  msg_25.m_end = (iterator)piVar11;
  msg_25.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_690,
             msg_25);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_698 = "";
  local_390._0_4_ = util::LockDirectory(&dirname,&lockname,true);
  pvVar6 = (iterator)&local_390;
  local_5dc = 0;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,util::LockResult,util::LockResult>
            (&local_148,&local_6a0,0x4e6,1,2,pvVar6,"util::LockDirectory(dirname, lockname, true)",
             &local_5dc,"util::LockResult::Success");
  ::signal(0x11,__handler);
  local_6b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_6a8 = "";
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x4ea;
  file_26.m_begin = (iterator)&local_6b0;
  msg_26.m_end = pvVar6;
  msg_26.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_6c0,
             msg_26);
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_011480b0;
  local_138 = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_6c8 = "";
  iVar4 = close(fd[1]);
  local_390 = CONCAT44(local_390._4_4_,iVar4);
  local_5dc = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_148,&local_6d0,0x4ea,1,2,&local_390,"close(fd[1])",&local_5dc,"0");
  ReleaseDirectoryLocks();
  std::filesystem::remove_all((path *)&dirname);
  std::thread::~thread(&thr);
  std::filesystem::__cxx11::path::~path(&lockname.super_path);
  std::filesystem::__cxx11::path::~path(&dirname.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_005bedc1:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_LockDirectory)
{
    fs::path dirname = m_args.GetDataDirBase() / "lock_dir";
    const fs::path lockname = ".lock";
#ifndef WIN32
    // Revert SIGCHLD to default, otherwise boost.test will catch and fail on
    // it: there is BOOST_TEST_IGNORE_SIGCHLD but that only works when defined
    // at build-time of the boost library
    void (*old_handler)(int) = signal(SIGCHLD, SIG_DFL);

    // Fork another process for testing before creating the lock, so that we
    // won't fork while holding the lock (which might be undefined, and is not
    // relevant as test case as that is avoided with -daemonize).
    int fd[2];
    BOOST_CHECK_EQUAL(socketpair(AF_UNIX, SOCK_STREAM, 0, fd), 0);
    pid_t pid = fork();
    if (!pid) {
        BOOST_CHECK_EQUAL(close(fd[1]), 0); // Child: close parent end
        TestOtherProcess(dirname, lockname, fd[0]);
    }
    BOOST_CHECK_EQUAL(close(fd[0]), 0); // Parent: close child end

    char ch;
    // Lock on non-existent directory should fail
    BOOST_CHECK_EQUAL(write(fd[1], &LockCommand, 1), 1);
    BOOST_CHECK_EQUAL(read(fd[1], &ch, 1), 1);
    BOOST_CHECK_EQUAL(ch, ResErrorWrite);
#endif
    // Lock on non-existent directory should fail
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname), util::LockResult::ErrorWrite);

    fs::create_directories(dirname);

    // Probing lock on new directory should succeed
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname, true), util::LockResult::Success);

    // Persistent lock on new directory should succeed
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname), util::LockResult::Success);

    // Another lock on the directory from the same thread should succeed
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname), util::LockResult::Success);

    // Another lock on the directory from a different thread within the same process should succeed
    util::LockResult threadresult;
    std::thread thr([&] { threadresult = util::LockDirectory(dirname, lockname); });
    thr.join();
    BOOST_CHECK_EQUAL(threadresult, util::LockResult::Success);
#ifndef WIN32
    // Try to acquire lock in child process while we're holding it, this should fail.
    BOOST_CHECK_EQUAL(write(fd[1], &LockCommand, 1), 1);
    BOOST_CHECK_EQUAL(read(fd[1], &ch, 1), 1);
    BOOST_CHECK_EQUAL(ch, ResErrorLock);

    // Give up our lock
    ReleaseDirectoryLocks();
    // Probing lock from our side now should succeed, but not hold on to the lock.
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname, true), util::LockResult::Success);

    // Try to acquire the lock in the child process, this should be successful.
    BOOST_CHECK_EQUAL(write(fd[1], &LockCommand, 1), 1);
    BOOST_CHECK_EQUAL(read(fd[1], &ch, 1), 1);
    BOOST_CHECK_EQUAL(ch, ResSuccess);

    // When we try to probe the lock now, it should fail.
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname, true), util::LockResult::ErrorLock);

    // Unlock the lock in the child process
    BOOST_CHECK_EQUAL(write(fd[1], &UnlockCommand, 1), 1);
    BOOST_CHECK_EQUAL(read(fd[1], &ch, 1), 1);
    BOOST_CHECK_EQUAL(ch, ResUnlockSuccess);

    // When we try to probe the lock now, it should succeed.
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname, true), util::LockResult::Success);

    // Re-lock the lock in the child process, then wait for it to exit, check
    // successful return. After that, we check that exiting the process
    // has released the lock as we would expect by probing it.
    int processstatus;
    BOOST_CHECK_EQUAL(write(fd[1], &LockCommand, 1), 1);
    // The following line invokes the ~CNetCleanup dtor without
    // a paired SetupNetworking call. This is acceptable as long as
    // ~CNetCleanup is a no-op for non-Windows platforms.
    BOOST_CHECK_EQUAL(write(fd[1], &ExitCommand, 1), 1);
    BOOST_CHECK_EQUAL(waitpid(pid, &processstatus, 0), pid);
    BOOST_CHECK_EQUAL(processstatus, 0);
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname, true), util::LockResult::Success);

    // Restore SIGCHLD
    signal(SIGCHLD, old_handler);
    BOOST_CHECK_EQUAL(close(fd[1]), 0); // Close our side of the socketpair
#endif
    // Clean up
    ReleaseDirectoryLocks();
    fs::remove_all(dirname);
}